

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O0

MachineConfiguration **
MT32Emu::MachineConfiguration::getAllMachineConfigurations(Bit32u *itemCount)

{
  int iVar1;
  Bit32u *itemCount_local;
  
  if (getAllMachineConfigurations(unsigned_int*)::romInfoLists == '\0') {
    iVar1 = __cxa_guard_acquire(&getAllMachineConfigurations(unsigned_int*)::romInfoLists);
    if (iVar1 != 0) {
      getAllMachineConfigurations::romInfoLists = getROMInfoLists();
      __cxa_guard_release(&getAllMachineConfigurations(unsigned_int*)::romInfoLists);
    }
  }
  if (getAllMachineConfigurations(unsigned_int*)::MT32_1_04 == '\0') {
    iVar1 = __cxa_guard_acquire(&getAllMachineConfigurations(unsigned_int*)::MT32_1_04);
    if (iVar1 != 0) {
      MachineConfiguration
                (&getAllMachineConfigurations::MT32_1_04,"mt32_1_04",
                 (getAllMachineConfigurations::romInfoLists->mt32_1_04).romInfos,
                 (getAllMachineConfigurations::romInfoLists->mt32_1_04).itemCount);
      __cxa_atexit(~MachineConfiguration,&getAllMachineConfigurations::MT32_1_04,&__dso_handle);
      __cxa_guard_release(&getAllMachineConfigurations(unsigned_int*)::MT32_1_04);
    }
  }
  if (getAllMachineConfigurations(unsigned_int*)::MT32_1_05 == '\0') {
    iVar1 = __cxa_guard_acquire(&getAllMachineConfigurations(unsigned_int*)::MT32_1_05);
    if (iVar1 != 0) {
      MachineConfiguration
                (&getAllMachineConfigurations::MT32_1_05,"mt32_1_05",
                 (getAllMachineConfigurations::romInfoLists->mt32_1_05).romInfos,
                 (getAllMachineConfigurations::romInfoLists->mt32_1_05).itemCount);
      __cxa_atexit(~MachineConfiguration,&getAllMachineConfigurations::MT32_1_05,&__dso_handle);
      __cxa_guard_release(&getAllMachineConfigurations(unsigned_int*)::MT32_1_05);
    }
  }
  if (getAllMachineConfigurations(unsigned_int*)::MT32_1_06 == '\0') {
    iVar1 = __cxa_guard_acquire(&getAllMachineConfigurations(unsigned_int*)::MT32_1_06);
    if (iVar1 != 0) {
      MachineConfiguration
                (&getAllMachineConfigurations::MT32_1_06,"mt32_1_06",
                 (getAllMachineConfigurations::romInfoLists->mt32_1_06).romInfos,
                 (getAllMachineConfigurations::romInfoLists->mt32_1_06).itemCount);
      __cxa_atexit(~MachineConfiguration,&getAllMachineConfigurations::MT32_1_06,&__dso_handle);
      __cxa_guard_release(&getAllMachineConfigurations(unsigned_int*)::MT32_1_06);
    }
  }
  if (getAllMachineConfigurations(unsigned_int*)::MT32_1_07 == '\0') {
    iVar1 = __cxa_guard_acquire(&getAllMachineConfigurations(unsigned_int*)::MT32_1_07);
    if (iVar1 != 0) {
      MachineConfiguration
                (&getAllMachineConfigurations::MT32_1_07,"mt32_1_07",
                 (getAllMachineConfigurations::romInfoLists->mt32_1_07).romInfos,
                 (getAllMachineConfigurations::romInfoLists->mt32_1_07).itemCount);
      __cxa_atexit(~MachineConfiguration,&getAllMachineConfigurations::MT32_1_07,&__dso_handle);
      __cxa_guard_release(&getAllMachineConfigurations(unsigned_int*)::MT32_1_07);
    }
  }
  if (getAllMachineConfigurations(unsigned_int*)::MT32_BLUER == '\0') {
    iVar1 = __cxa_guard_acquire(&getAllMachineConfigurations(unsigned_int*)::MT32_BLUER);
    if (iVar1 != 0) {
      MachineConfiguration
                (&getAllMachineConfigurations::MT32_BLUER,"mt32_bluer",
                 (getAllMachineConfigurations::romInfoLists->mt32_bluer).romInfos,
                 (getAllMachineConfigurations::romInfoLists->mt32_bluer).itemCount);
      __cxa_atexit(~MachineConfiguration,&getAllMachineConfigurations::MT32_BLUER,&__dso_handle);
      __cxa_guard_release(&getAllMachineConfigurations(unsigned_int*)::MT32_BLUER);
    }
  }
  if (getAllMachineConfigurations(unsigned_int*)::MT32_2_03 == '\0') {
    iVar1 = __cxa_guard_acquire(&getAllMachineConfigurations(unsigned_int*)::MT32_2_03);
    if (iVar1 != 0) {
      MachineConfiguration
                (&getAllMachineConfigurations::MT32_2_03,"mt32_2_03",
                 (getAllMachineConfigurations::romInfoLists->mt32_2_03).romInfos,
                 (getAllMachineConfigurations::romInfoLists->mt32_2_03).itemCount);
      __cxa_atexit(~MachineConfiguration,&getAllMachineConfigurations::MT32_2_03,&__dso_handle);
      __cxa_guard_release(&getAllMachineConfigurations(unsigned_int*)::MT32_2_03);
    }
  }
  if (getAllMachineConfigurations(unsigned_int*)::MT32_2_04 == '\0') {
    iVar1 = __cxa_guard_acquire(&getAllMachineConfigurations(unsigned_int*)::MT32_2_04);
    if (iVar1 != 0) {
      MachineConfiguration
                (&getAllMachineConfigurations::MT32_2_04,"mt32_2_04",
                 (getAllMachineConfigurations::romInfoLists->mt32_2_04).romInfos,
                 (getAllMachineConfigurations::romInfoLists->mt32_2_04).itemCount);
      __cxa_atexit(~MachineConfiguration,&getAllMachineConfigurations::MT32_2_04,&__dso_handle);
      __cxa_guard_release(&getAllMachineConfigurations(unsigned_int*)::MT32_2_04);
    }
  }
  if (getAllMachineConfigurations(unsigned_int*)::MT32_2_06 == '\0') {
    iVar1 = __cxa_guard_acquire(&getAllMachineConfigurations(unsigned_int*)::MT32_2_06);
    if (iVar1 != 0) {
      MachineConfiguration
                (&getAllMachineConfigurations::MT32_2_06,"mt32_2_06",
                 (getAllMachineConfigurations::romInfoLists->mt32_2_06).romInfos,
                 (getAllMachineConfigurations::romInfoLists->mt32_2_06).itemCount);
      __cxa_atexit(~MachineConfiguration,&getAllMachineConfigurations::MT32_2_06,&__dso_handle);
      __cxa_guard_release(&getAllMachineConfigurations(unsigned_int*)::MT32_2_06);
    }
  }
  if (getAllMachineConfigurations(unsigned_int*)::MT32_2_07 == '\0') {
    iVar1 = __cxa_guard_acquire(&getAllMachineConfigurations(unsigned_int*)::MT32_2_07);
    if (iVar1 != 0) {
      MachineConfiguration
                (&getAllMachineConfigurations::MT32_2_07,"mt32_2_07",
                 (getAllMachineConfigurations::romInfoLists->mt32_2_07).romInfos,
                 (getAllMachineConfigurations::romInfoLists->mt32_2_07).itemCount);
      __cxa_atexit(~MachineConfiguration,&getAllMachineConfigurations::MT32_2_07,&__dso_handle);
      __cxa_guard_release(&getAllMachineConfigurations(unsigned_int*)::MT32_2_07);
    }
  }
  if (getAllMachineConfigurations(unsigned_int*)::CM32L_1_00 == '\0') {
    iVar1 = __cxa_guard_acquire(&getAllMachineConfigurations(unsigned_int*)::CM32L_1_00);
    if (iVar1 != 0) {
      MachineConfiguration
                (&getAllMachineConfigurations::CM32L_1_00,"cm32l_1_00",
                 (getAllMachineConfigurations::romInfoLists->cm32l_1_00).romInfos,
                 (getAllMachineConfigurations::romInfoLists->cm32l_1_00).itemCount);
      __cxa_atexit(~MachineConfiguration,&getAllMachineConfigurations::CM32L_1_00,&__dso_handle);
      __cxa_guard_release(&getAllMachineConfigurations(unsigned_int*)::CM32L_1_00);
    }
  }
  if (getAllMachineConfigurations(unsigned_int*)::CM32L_1_02 == '\0') {
    iVar1 = __cxa_guard_acquire(&getAllMachineConfigurations(unsigned_int*)::CM32L_1_02);
    if (iVar1 != 0) {
      MachineConfiguration
                (&getAllMachineConfigurations::CM32L_1_02,"cm32l_1_02",
                 (getAllMachineConfigurations::romInfoLists->cm32l_1_02).romInfos,
                 (getAllMachineConfigurations::romInfoLists->cm32l_1_02).itemCount);
      __cxa_atexit(~MachineConfiguration,&getAllMachineConfigurations::CM32L_1_02,&__dso_handle);
      __cxa_guard_release(&getAllMachineConfigurations(unsigned_int*)::CM32L_1_02);
    }
  }
  if (getAllMachineConfigurations(unsigned_int*)::CM32LN_1_00 == '\0') {
    iVar1 = __cxa_guard_acquire(&getAllMachineConfigurations(unsigned_int*)::CM32LN_1_00);
    if (iVar1 != 0) {
      MachineConfiguration
                (&getAllMachineConfigurations::CM32LN_1_00,"cm32ln_1_00",
                 (getAllMachineConfigurations::romInfoLists->cm32ln_1_00).romInfos,
                 (getAllMachineConfigurations::romInfoLists->cm32ln_1_00).itemCount);
      __cxa_atexit(~MachineConfiguration,&getAllMachineConfigurations::CM32LN_1_00,&__dso_handle);
      __cxa_guard_release(&getAllMachineConfigurations(unsigned_int*)::CM32LN_1_00);
    }
  }
  if (itemCount != (Bit32u *)0x0) {
    *itemCount = 0xc;
  }
  return getAllMachineConfigurations::MACHINE_CONFIGURATIONS;
}

Assistant:

const MachineConfiguration * const *MachineConfiguration::getAllMachineConfigurations(Bit32u *itemCount) {
	static const ROMInfoLists &romInfoLists = getROMInfoLists();
	static const MachineConfiguration MT32_1_04 = MachineConfiguration("mt32_1_04", romInfoLists.mt32_1_04.romInfos, romInfoLists.mt32_1_04.itemCount);
	static const MachineConfiguration MT32_1_05 = MachineConfiguration("mt32_1_05", romInfoLists.mt32_1_05.romInfos, romInfoLists.mt32_1_05.itemCount);
	static const MachineConfiguration MT32_1_06 = MachineConfiguration("mt32_1_06", romInfoLists.mt32_1_06.romInfos, romInfoLists.mt32_1_06.itemCount);
	static const MachineConfiguration MT32_1_07 = MachineConfiguration("mt32_1_07", romInfoLists.mt32_1_07.romInfos, romInfoLists.mt32_1_07.itemCount);
	static const MachineConfiguration MT32_BLUER = MachineConfiguration("mt32_bluer", romInfoLists.mt32_bluer.romInfos, romInfoLists.mt32_bluer.itemCount);
	static const MachineConfiguration MT32_2_03 = MachineConfiguration("mt32_2_03", romInfoLists.mt32_2_03.romInfos, romInfoLists.mt32_2_03.itemCount);
	static const MachineConfiguration MT32_2_04 = MachineConfiguration("mt32_2_04", romInfoLists.mt32_2_04.romInfos, romInfoLists.mt32_2_04.itemCount);
	static const MachineConfiguration MT32_2_06 = MachineConfiguration("mt32_2_06", romInfoLists.mt32_2_06.romInfos, romInfoLists.mt32_2_06.itemCount);
	static const MachineConfiguration MT32_2_07 = MachineConfiguration("mt32_2_07", romInfoLists.mt32_2_07.romInfos, romInfoLists.mt32_2_07.itemCount);
	static const MachineConfiguration CM32L_1_00 = MachineConfiguration("cm32l_1_00", romInfoLists.cm32l_1_00.romInfos, romInfoLists.cm32l_1_00.itemCount);
	static const MachineConfiguration CM32L_1_02 = MachineConfiguration("cm32l_1_02", romInfoLists.cm32l_1_02.romInfos, romInfoLists.cm32l_1_02.itemCount);
	static const MachineConfiguration CM32LN_1_00 = MachineConfiguration("cm32ln_1_00", romInfoLists.cm32ln_1_00.romInfos, romInfoLists.cm32ln_1_00.itemCount);
	static const MachineConfiguration * const MACHINE_CONFIGURATIONS[] = {
		&MT32_1_04, &MT32_1_05, &MT32_1_06, &MT32_1_07, &MT32_BLUER, &MT32_2_03, &MT32_2_04, &MT32_2_06, &MT32_2_07, &CM32L_1_00, &CM32L_1_02, &CM32LN_1_00, NULL
	};

	if (itemCount != NULL) *itemCount = _CALC_ARRAY_LENGTH(MACHINE_CONFIGURATIONS);
	return MACHINE_CONFIGURATIONS;
}